

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSetTest_Subset_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldSetTest_Subset_Test *this)

{
  RepeatedField<int> *pRVar1;
  bool bVar2;
  char *in_R9;
  pointer *__ptr;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  AssertHelper local_370;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_368;
  internal local_360 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  string local_350;
  undefined1 local_330 [184];
  undefined1 local_278 [184];
  MessageDifferencer local_1c0;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_278,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_330,(Arena *)0x0);
  pRVar1 = (RepeatedField<int> *)(local_278 + 0x60);
  RepeatedField<int>::Add(pRVar1,3);
  RepeatedField<int>::Add(pRVar1,8);
  RepeatedField<int>::Add(pRVar1,2);
  pRVar1 = (RepeatedField<int> *)(local_330 + 0x60);
  RepeatedField<int>::Add(pRVar1,2);
  RepeatedField<int>::Add(pRVar1,3);
  RepeatedField<int>::Add(pRVar1,5);
  RepeatedField<int>::Add(pRVar1,8);
  util::MessageDifferencer::MessageDifferencer(&local_1c0);
  util::MessageDifferencer::set_scope(&local_1c0,PARTIAL);
  util::MessageDifferencer::set_repeated_field_comparison(&local_1c0,AS_LIST);
  bVar2 = util::MessageDifferencer::Compare(&local_1c0,(Message *)local_278,(Message *)local_330);
  local_360[0] = (internal)!bVar2;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_350,local_360,(AssertionResult *)0x122213d,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9e4,local_350._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_368._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368._M_head_impl + 8))();
    }
    if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_358,local_358);
    }
  }
  util::MessageDifferencer::set_scope(&local_1c0,FULL);
  util::MessageDifferencer::set_repeated_field_comparison(&local_1c0,AS_SET);
  bVar2 = util::MessageDifferencer::Compare(&local_1c0,(Message *)local_278,(Message *)local_330);
  local_360[0] = (internal)!bVar2;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_350,local_360,(AssertionResult *)0x122213d,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9e9,local_350._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_368._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368._M_head_impl + 8))();
    }
    if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_358,local_358);
    }
  }
  util::MessageDifferencer::set_scope(&local_1c0,PARTIAL);
  util::MessageDifferencer::set_repeated_field_comparison(&local_1c0,AS_SET);
  local_360[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c0,(Message *)local_278,(Message *)local_330);
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_360[0]) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_350,local_360,(AssertionResult *)0x122213d,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9ee,local_350._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_368._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368._M_head_impl + 8))();
    }
    if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_358,local_358);
    }
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c0);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_330);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_278);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSetTest_Subset) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  msg1.add_rv(3);
  msg1.add_rv(8);
  msg1.add_rv(2);
  msg2.add_rv(2);
  msg2.add_rv(3);
  msg2.add_rv(5);
  msg2.add_rv(8);

  util::MessageDifferencer differencer;

  // Fail with only partial scope set.
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  differencer.set_repeated_field_comparison(util::MessageDifferencer::AS_LIST);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));

  // Fail with only set-like comparison set.
  differencer.set_scope(util::MessageDifferencer::FULL);
  differencer.set_repeated_field_comparison(util::MessageDifferencer::AS_SET);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));

  // Succeed with scope and repeated field comparison set properly.
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  differencer.set_repeated_field_comparison(util::MessageDifferencer::AS_SET);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}